

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::handle_key(Plotter *this,int key,bool ctrl,bool shift,bool alt)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  uVar9 = 0;
  uVar10 = 0x3ff00000;
  if (0x4e < key) {
    if (key < 0xbd) {
      if (key < 0xad) {
        if (key != 0x4f) {
          if (key != 0x50) {
            return;
          }
          if (this->polar_grid != false) {
            return;
          }
          this->polar_grid = true;
          this->require_update = true;
          return;
        }
        if (this->polar_grid != true) {
          return;
        }
        this->polar_grid = false;
        goto LAB_0012b450;
      }
      if ((key != 0xad) && (key != 0xbb)) {
        return;
      }
LAB_0012b391:
      uVar9 = (undefined4)*(undefined8 *)(&DAT_0021b860 + (ulong)(key == 0xad) * 8);
      uVar10 = (undefined4)
               ((ulong)*(undefined8 *)(&DAT_0021b860 + (ulong)(key == 0xad) * 8) >> 0x20);
    }
    else {
      if (key - 0x106U < 2) goto switchD_0012b23a_caseD_25;
      if (key - 0x108U < 2) goto switchD_0012b23a_caseD_26;
      if (key != 0xbd) {
        return;
      }
    }
switchD_0012b23a_caseD_2d:
    dVar5 = (this->view).ymin;
    dVar11 = (double)CONCAT44(uVar10,uVar9) * 0.013 + 1.0 + -1.0;
    dVar1 = (this->view).xmax;
    dVar7 = (this->view).xmin;
    dVar8 = (this->view).ymax;
    dVar6 = dVar11 * (dVar8 - dVar5) * 0.5;
    auVar12._0_4_ = (int)((uint)alt * -0x80000000) >> 0x1f;
    auVar12._4_4_ = (int)((uint)alt << 0x1f) >> 0x1f;
    auVar12._8_4_ = (int)((uint)shift << 0x1f) >> 0x1f;
    auVar12._12_4_ = (int)((uint)shift * -0x80000000) >> 0x1f;
    auVar3._8_4_ = SUB84(dVar6,0);
    auVar3._0_8_ = dVar11 * (dVar1 - dVar7) * 0.5;
    auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
    dVar11 = SUB168(~auVar12 & auVar3,0);
    (this->view).xmax = dVar1 + dVar11;
    dVar1 = SUB168(~auVar12 & auVar3,8);
    (this->view).ymin = dVar5 - dVar1;
    (this->view).xmin = dVar7 - dVar11;
    (this->view).ymax = dVar1 + dVar8;
    goto LAB_0012b450;
  }
  if (key < 0x3d) {
    switch(key) {
    case 0x25:
    case 0x27:
switchD_0012b23a_caseD_25:
      dVar5 = (this->view).xmax;
      dVar1 = (this->view).xmin;
      dVar11 = (dVar5 - dVar1) * 0.003;
      if ((key == 0x107) || (key == 0x25)) {
        dVar11 = -dVar11;
      }
      dVar5 = dVar5 + dVar11;
      dVar1 = dVar1 + dVar11;
      auVar4._8_4_ = SUB84(dVar1,0);
      auVar4._0_8_ = dVar5;
      auVar4._12_4_ = (int)((ulong)dVar1 >> 0x20);
      (this->view).xmax = dVar5;
      (this->view).xmin = (double)auVar4._8_8_;
      goto LAB_0012b450;
    case 0x26:
    case 0x28:
switchD_0012b23a_caseD_26:
      dVar5 = (this->view).ymax;
      dVar1 = (this->view).ymin;
      dVar11 = (dVar5 - dVar1) * 0.003;
      if ((key == 0x108) || (key == 0x28)) {
        dVar11 = -dVar11;
      }
      dVar5 = dVar5 + dVar11;
      dVar1 = dVar1 + dVar11;
      break;
    default:
      goto switchD_0012b23a_caseD_29;
    case 0x2d:
      goto switchD_0012b23a_caseD_2d;
    case 0x30:
      goto switchD_0012b23a_caseD_30;
    }
  }
  else {
    if (key == 0x3d) goto LAB_0012b391;
    if (key == 0x45) {
      this->focus_on_editor = true;
      return;
    }
    if (key != 0x48) {
      return;
    }
switchD_0012b23a_caseD_30:
    if (!ctrl) {
switchD_0012b23a_caseD_29:
      return;
    }
    dVar5 = (((double)(this->view).swid * 10.0) / (double)(this->view).shigh) * 0.6;
    (this->view).xmax = dVar5;
    (this->view).xmin = -dVar5;
    dVar5 = 6.0;
    dVar1 = -6.0;
  }
  auVar2._8_4_ = SUB84(dVar1,0);
  auVar2._0_8_ = dVar5;
  auVar2._12_4_ = (int)((ulong)dVar1 >> 0x20);
  (this->view).ymax = dVar5;
  (this->view).ymin = (double)auVar2._8_8_;
LAB_0012b450:
  this->require_update = true;
  return;
}

Assistant:

void Plotter::handle_key(int key, bool ctrl, bool shift, bool alt) {
#ifdef NIVALIS_EMSCRIPTEN
    static const double scale = 2.0;
#else
    static const double scale = 1.0;
#endif
    switch(key) {
        case 37: case 39: case 262: case 263:
            // LR Arrow
            {
                auto delta = (view.xmax - view.xmin) * 0.003 * scale;
                if (key == 37 || key == 263) delta = -delta;
                view.xmin += delta; view.xmax += delta;
            }
            require_update = true;
            break;
        case 38: case 40: case 264: case 265:
            {
                // UD Arrow
                auto delta = (view.ymax - view.ymin) * 0.003 * scale;
                if (key == 40 || key == 264) delta = -delta;
                view.ymin += delta; view.ymax += delta;
            }
            require_update = true;
            break;
        case 61: case 45:
        case 187: case 189:
        case 173:
            // Zooming +-
            {
                auto fa = 1 + 0.013 * ((key == 45 || key == 189 ||
                            key == 173) ? scale : -scale);
                auto dy = (view.ymax - view.ymin) * (fa - 1.) /2;
                auto dx = (view.xmax - view.xmin) * (fa - 1.) /2;
                if (shift) dy = 0.; // x-only
                if (alt) dx = 0.;  // y-only
                view.xmin -= dx; view.xmax += dx;
                view.ymin -= dy; view.ymax += dy;
                require_update = true;
            }
            break;
        case 48: case 72:
            // ctrl 0/H: Home
            if (ctrl) {
                reset_view();
            }
            break;
        case 80:
            // P: Polar grid
            if (!polar_grid) {
                polar_grid = true;
                require_update = true;
            }
            break;
        case 79:
            // O: Cartesian grid
            if (polar_grid) {
                polar_grid = false;
                require_update = true;
            }
            break;
        case 69:
            // E: Edit (focus editor)
            focus_on_editor = true;
            break;
    }
}